

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

bool __thiscall Bipartition::isEmpty(Bipartition *this)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000028;
  undefined1 local_9;
  
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cb2cb);
  local_9 = true;
  if (!bVar1) {
    local_9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
                        (in_stack_00000028);
  }
  return local_9;
}

Assistant:

bool Bipartition::isEmpty() {
    return partition.none() || partition.all();
}